

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conjgrad.c
# Opt level: O0

int icholu(double *A,int N)

{
  int iVar1;
  double *U22_00;
  double *U22;
  int sc;
  int t;
  int j;
  int i;
  int stride;
  int N_local;
  double *A_local;
  
  U22_00 = (double *)malloc((long)N * 8 * (long)N);
  iVar1 = richolu(A,N,N,U22_00);
  for (t = 0; t < N; t = t + 1) {
    for (sc = 0; sc < t; sc = sc + 1) {
      A[t * N + sc] = 0.0;
    }
  }
  free(U22_00);
  return iVar1;
}

Assistant:

static int icholu(double *A, int N) {
	int stride,i,j,t,sc;
	double *U22;
	U22 = (double*) malloc(sizeof(double) * N * N);
	stride = N; 
	
	sc = richolu(A,N,stride,U22);
	
	for(i=0; i < N;++i) {
		t = i *N;
		for(j=0;j < i;++j) {
			A[t+j] = 0.;
		}
	}

	free(U22);
	return sc;
	
}